

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O2

void ModulusHelper<signed_char,_unsigned_long,_4>::
     ModulusThrow<safeint_exception_handlers::SafeInt_InvalidParameter>
               (char *t,unsigned_long *u,char *result)

{
  uint32_t uVar1;
  char cVar2;
  
  if (*u != 0) {
    cVar2 = *t;
    if ((long)cVar2 < 0) {
      uVar1 = AbsValueHelper<signed_char,_0>::Abs(cVar2);
      cVar2 = -(char)((ulong)uVar1 % *u);
    }
    else {
      cVar2 = (char)((ulong)(long)cVar2 % *u);
    }
    *result = cVar2;
    return;
  }
  safeint_exception_handlers::SafeInt_InvalidParameter::SafeIntOnDivZero();
}

Assistant:

SAFEINT_CONSTEXPR14 static void ModulusThrow( const T& t, const U& u, T& result ) SAFEINT_CPP_THROW
    {
        if(u == 0)
            E::SafeIntOnDivZero();

        //t could be negative - if so, need to convert to positive
        if(t < 0)
            result = (T)( ~( AbsValueHelper< T, GetAbsMethod< T >::method >::Abs( t ) % u ) + 1);
        else
            result = (T)( (T)t % u );
    }